

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanStatus ZydisEmitLegacyPrefixes(ZydisEncoderInstruction *instruction,ZydisEncoderBuffer *buffer)

{
  bool bVar1;
  ZyanStatus status_047620348_11;
  ZyanStatus status_047620348_10;
  ZyanStatus status_047620348_9;
  ZyanStatus status_047620348_8;
  ZyanStatus status_047620348_7;
  ZyanStatus status_047620348_6;
  ZyanStatus status_047620348_5;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZyanBool compressed_prefixes;
  ZydisEncoderBuffer *buffer_local;
  ZydisEncoderInstruction *instruction_local;
  
  bVar1 = instruction->encoding - ZYDIS_INSTRUCTION_ENCODING_XOP < 4;
  if ((((((instruction->attributes & 0x8000000) == 0) ||
        (instruction_local._4_4_ = ZydisEmitByte(0xf0,buffer),
        (instruction_local._4_4_ & 0x80000000) == 0)) &&
       ((bVar1 || ((((instruction->attributes & 0x1c0000000) == 0 ||
                    (instruction_local._4_4_ = ZydisEmitByte(0xf2,buffer),
                    (instruction_local._4_4_ & 0x80000000) == 0)) &&
                   (((instruction->attributes & 0x230000000) == 0 ||
                    (instruction_local._4_4_ = ZydisEmitByte(0xf3,buffer),
                    (instruction_local._4_4_ & 0x80000000) == 0)))))))) &&
      (((((instruction->attributes & 0x2400000000) == 0 ||
         (instruction_local._4_4_ = ZydisEmitByte('.',buffer),
         (instruction_local._4_4_ & 0x80000000) == 0)) &&
        (((instruction->attributes & 0x4000000000) == 0 ||
         (instruction_local._4_4_ = ZydisEmitByte('6',buffer),
         (instruction_local._4_4_ & 0x80000000) == 0)))) &&
       (((((((instruction->attributes & 0x8800000000) == 0 ||
            (instruction_local._4_4_ = ZydisEmitByte('>',buffer),
            (instruction_local._4_4_ & 0x80000000) == 0)) &&
           (((instruction->attributes & 0x10000000000) == 0 ||
            (instruction_local._4_4_ = ZydisEmitByte('&',buffer),
            (instruction_local._4_4_ & 0x80000000) == 0)))) &&
          (((instruction->attributes & 0x20000000000) == 0 ||
           (instruction_local._4_4_ = ZydisEmitByte('d',buffer),
           (instruction_local._4_4_ & 0x80000000) == 0)))) &&
         (((instruction->attributes & 0x40000000000) == 0 ||
          (instruction_local._4_4_ = ZydisEmitByte('e',buffer),
          (instruction_local._4_4_ & 0x80000000) == 0)))) &&
        ((((instruction->attributes & 0x1000000000) == 0 ||
          (instruction_local._4_4_ = ZydisEmitByte('>',buffer),
          (instruction_local._4_4_ & 0x80000000) == 0)) &&
         ((bVar1 || (((instruction->attributes & 0x80000000000) == 0 ||
                     (instruction_local._4_4_ = ZydisEmitByte('f',buffer),
                     (instruction_local._4_4_ & 0x80000000) == 0)))))))))))) &&
     (((instruction->attributes & 0x100000000000) == 0 ||
      (instruction_local._4_4_ = ZydisEmitByte('g',buffer),
      (instruction_local._4_4_ & 0x80000000) == 0)))) {
    instruction_local._4_4_ = 0x100000;
  }
  return instruction_local._4_4_;
}

Assistant:

static ZyanStatus ZydisEmitLegacyPrefixes(const ZydisEncoderInstruction *instruction,
    ZydisEncoderBuffer *buffer)
{
    ZyanBool compressed_prefixes = ZYAN_FALSE;
    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
        compressed_prefixes = ZYAN_TRUE;
        break;
    default:
        break;
    }

    // Group 1
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_LOCK)
    {
        ZYAN_CHECK(ZydisEmitByte(0xF0, buffer));
    }
    if (!compressed_prefixes)
    {
        if (instruction->attributes & (ZYDIS_ATTRIB_HAS_REPNE |
                                       ZYDIS_ATTRIB_HAS_BND |
                                       ZYDIS_ATTRIB_HAS_XACQUIRE))
        {
            ZYAN_CHECK(ZydisEmitByte(0xF2, buffer));
        }
        if (instruction->attributes & (ZYDIS_ATTRIB_HAS_REP |
                                       ZYDIS_ATTRIB_HAS_REPE |
                                       ZYDIS_ATTRIB_HAS_XRELEASE))
        {
            ZYAN_CHECK(ZydisEmitByte(0xF3, buffer));
        }
    }

    // Group 2
    if (instruction->attributes & (ZYDIS_ATTRIB_HAS_SEGMENT_CS |
                                   ZYDIS_ATTRIB_HAS_BRANCH_NOT_TAKEN))
    {
        ZYAN_CHECK(ZydisEmitByte(0x2E, buffer));
    }
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_SEGMENT_SS)
    {
        ZYAN_CHECK(ZydisEmitByte(0x36, buffer));
    }
    if (instruction->attributes & (ZYDIS_ATTRIB_HAS_SEGMENT_DS |
                                   ZYDIS_ATTRIB_HAS_BRANCH_TAKEN))
    {
        ZYAN_CHECK(ZydisEmitByte(0x3E, buffer));
    }
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_SEGMENT_ES)
    {
        ZYAN_CHECK(ZydisEmitByte(0x26, buffer));
    }
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_SEGMENT_FS)
    {
        ZYAN_CHECK(ZydisEmitByte(0x64, buffer));
    }
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_SEGMENT_GS)
    {
        ZYAN_CHECK(ZydisEmitByte(0x65, buffer));
    }
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_NOTRACK)
    {
        ZYAN_CHECK(ZydisEmitByte(0x3E, buffer));
    }

    // Group 3
    if (!compressed_prefixes)
    {
        if (instruction->attributes & ZYDIS_ATTRIB_HAS_OPERANDSIZE)
        {
            ZYAN_CHECK(ZydisEmitByte(0x66, buffer));
        }
    }

    // Group 4
    if (instruction->attributes & ZYDIS_ATTRIB_HAS_ADDRESSSIZE)
    {
        ZYAN_CHECK(ZydisEmitByte(0x67, buffer));
    }

    return ZYAN_STATUS_SUCCESS;
}